

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int deleteCell(Rtree *pRtree,RtreeNode *pNode,int iCell,int iHeight)

{
  u8 *puVar1;
  int iVar2;
  int iVar3;
  sqlite3_int64 iNode;
  ushort uVar4;
  RtreeNode *pRVar5;
  ulong uVar6;
  RtreeNode *ppNode;
  
  ppNode = pNode;
  iVar2 = 0;
  do {
    if (iVar2 != 0) {
      return iVar2;
    }
    if ((ppNode->iNode == 1) || (ppNode->pParent != (RtreeNode *)0x0)) {
      puVar1 = pNode->zData;
      uVar6 = (ulong)pRtree->nBytesPerCell;
      memmove(puVar1 + uVar6 * (long)iCell + 4,puVar1 + uVar6 + uVar6 * (long)iCell + 4,
              (long)(int)(~iCell + (uint)(ushort)(*(ushort *)(puVar1 + 2) << 8 |
                                                 *(ushort *)(puVar1 + 2) >> 8)) * uVar6);
      puVar1 = pNode->zData;
      uVar4 = ((ushort)puVar1[2] * 0x100 + (ushort)puVar1[3]) - 1;
      *(ushort *)(puVar1 + 2) = uVar4 * 0x100 | uVar4 >> 8;
      pNode->isDirty = 1;
      if (pNode->pParent == (RtreeNode *)0x0) {
        return 0;
      }
      uVar6 = (long)(pRtree->iNodeSize + -4) / (long)(int)(uint)pRtree->nBytesPerCell;
      if ((int)(uint)(ushort)(*(ushort *)(pNode->zData + 2) << 8 |
                             *(ushort *)(pNode->zData + 2) >> 8) <
          (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / 3)) {
        iVar2 = removeNode(pRtree,pNode,iHeight);
        return iVar2;
      }
      iVar2 = fixBoundingBox(pRtree,pNode);
      return iVar2;
    }
    sqlite3_bind_int64(pRtree->pReadParent,1,ppNode->iNode);
    iVar2 = sqlite3_step(pRtree->pReadParent);
    iVar3 = 0;
    if (iVar2 == 100) {
      iNode = sqlite3_column_int64(pRtree->pReadParent,0);
      for (pRVar5 = pNode; pRVar5 != (RtreeNode *)0x0; pRVar5 = pRVar5->pParent) {
        iVar3 = 0;
        if (pRVar5->iNode == iNode) goto LAB_001dcb6a;
      }
      iVar3 = nodeAcquire(pRtree,iNode,(RtreeNode *)0x0,&ppNode->pParent);
    }
LAB_001dcb6a:
    iVar2 = sqlite3_reset(pRtree->pReadParent);
    if (iVar2 != 0) {
      iVar3 = iVar2;
    }
    ppNode = ppNode->pParent;
    iVar2 = 0;
    if (ppNode == (RtreeNode *)0x0) {
      iVar2 = 0x10b;
    }
    if (iVar3 != 0) {
      iVar2 = iVar3;
    }
  } while( true );
}

Assistant:

static int deleteCell(Rtree *pRtree, RtreeNode *pNode, int iCell, int iHeight){
  RtreeNode *pParent;
  int rc;

  if( SQLITE_OK!=(rc = fixLeafParent(pRtree, pNode)) ){
    return rc;
  }

  /* Remove the cell from the node. This call just moves bytes around
  ** the in-memory node image, so it cannot fail.
  */
  nodeDeleteCell(pRtree, pNode, iCell);

  /* If the node is not the tree root and now has less than the minimum
  ** number of cells, remove it from the tree. Otherwise, update the
  ** cell in the parent node so that it tightly contains the updated
  ** node.
  */
  pParent = pNode->pParent;
  assert( pParent || pNode->iNode==1 );
  if( pParent ){
    if( NCELL(pNode)<RTREE_MINCELLS(pRtree) ){
      rc = removeNode(pRtree, pNode, iHeight);
    }else{
      rc = fixBoundingBox(pRtree, pNode);
    }
  }

  return rc;
}